

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComputedValues.cpp
# Opt level: O1

String * __thiscall
Rml::Style::ComputedValues::cursor_abi_cxx11_(String *__return_storage_ptr__,ComputedValues *this)

{
  Property *this_00;
  
  this_00 = Element::GetProperty(this->element,Cursor);
  if (this_00 == (Property *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    Property::Get<std::__cxx11::string>(__return_storage_ptr__,this_00);
  }
  return __return_storage_ptr__;
}

Assistant:

String Style::ComputedValues::cursor() const
{
	if (auto p = element->GetProperty(PropertyId::Cursor))
		return p->Get<String>();

	return String();
}